

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.cpp
# Opt level: O1

void __thiscall jbcoin::STAccount::STAccount(STAccount *this,SerialIter *sit,SField *name)

{
  uint8_t *local_30;
  
  SerialIter::getVLDataLength(sit);
  SerialIter::getRawHelper<jbcoin::Buffer>((SerialIter *)&local_30,(int)sit);
  STAccount(this,name,(Buffer *)&local_30);
  if (local_30 != (uint8_t *)0x0) {
    operator_delete__(local_30);
  }
  return;
}

Assistant:

STAccount::STAccount (SerialIter& sit, SField const& name)
    : STAccount(name, sit.getVLBuffer())
{
}